

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::copy_example_data(example *dst,example *src,int oas)

{
  label_t lVar1;
  wclass *pwVar2;
  size_t sVar3;
  
  if (oas == 0) {
    (dst->l).cb_eval.event.costs.erase_count = (src->l).cb_eval.event.costs.erase_count;
    lVar1 = (src->l).multi;
    pwVar2 = (src->l).cs.costs._end;
    sVar3 = (src->l).cs.costs.erase_count;
    (dst->l).cs.costs.end_array = (src->l).cs.costs.end_array;
    (dst->l).cs.costs.erase_count = sVar3;
    (dst->l).multi = lVar1;
    (dst->l).cs.costs._end = pwVar2;
    (dst->l).simple.label = (src->l).simple.label;
  }
  else {
    v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)&(dst->l).simple);
    copy_array<unsigned_int>
              ((v_array<unsigned_int> *)&(dst->l).simple,(v_array<unsigned_int> *)&(src->l).simple);
  }
  VW::copy_example_data(false,dst,src);
  return;
}

Assistant:

void copy_example_data(example* dst, example* src, int oas = false) //copy example data. 
    { 
        if (oas == false){
            dst->l = src->l;
            dst->l.multi.label = src->l.multi.label;
        }
        else{
            dst->l.multilabels.label_v.delete_v();
            copy_array(dst->l.multilabels.label_v, src->l.multilabels.label_v);
        }
        VW::copy_example_data(false, dst, src);
    }